

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O0

void __thiscall QUndoGroup::~QUndoGroup(QUndoGroup *this)

{
  bool bVar1;
  QUndoGroupPrivate *this_00;
  iterator o;
  QUndoStackPrivate *pQVar2;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QUndoGroupPrivate *d;
  iterator end;
  iterator it;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00e24408;
  this_00 = d_func((QUndoGroup *)0xa885a7);
  local_10.i = (QUndoStack **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QUndoStack_*>::begin((QList<QUndoStack_*> *)this_00);
  o = QList<QUndoStack_*>::end((QList<QUndoStack_*> *)this_00);
  while( true ) {
    bVar1 = QList<QUndoStack_*>::iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QUndoStack_*>::iterator::operator*(&local_10);
    pQVar2 = QUndoStack::d_func((QUndoStack *)0xa88621);
    pQVar2->group = (QUndoGroup *)0x0;
    QList<QUndoStack_*>::iterator::operator++(&local_10);
  }
  QObject::~QObject(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUndoGroup::~QUndoGroup()
{
    // Ensure all QUndoStacks no longer refer to this group.
    Q_D(QUndoGroup);
    QList<QUndoStack *>::iterator it = d->stack_list.begin();
    QList<QUndoStack *>::iterator end = d->stack_list.end();
    while (it != end) {
        (*it)->d_func()->group = nullptr;
        ++it;
    }
}